

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O3

int __thiscall
gl4cts::ClipControlRenderBaseTest::init(ClipControlRenderBaseTest *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  
  iVar3 = (*((this->super_ClipControlBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  uVar1 = *(undefined4 *)CONCAT44(extraout_var,iVar3);
  uVar2 = ((undefined4 *)CONCAT44(extraout_var,iVar3))[1];
  iVar3 = (*((this->super_ClipControlBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  (**(code **)(lVar4 + 0x6d0))(1,&(this->super_ClipControlBaseTest).field_0x7c);
  (**(code **)(lVar4 + 0x6e8))(1,&this->m_rboC);
  (**(code **)(lVar4 + 0x6e8))(1,&this->m_rboD);
  (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rboC);
  (**(code **)(lVar4 + 0x1238))(0x8d41,0x8058,uVar1,uVar2);
  (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rboD);
  (**(code **)(lVar4 + 0x1238))(0x8d41,0x81a6,uVar1,uVar2);
  (**(code **)(lVar4 + 0x78))(0x8d40,*(undefined4 *)&(this->super_ClipControlBaseTest).field_0x7c);
  (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rboC);
  iVar3 = (**(code **)(lVar4 + 0x688))(0x8d40,0x8d00,0x8d41,this->m_rboD);
  return iVar3;
}

Assistant:

virtual void init(void)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		glw::GLuint				 viewportW	= renderTarget.getWidth();
		glw::GLuint				 viewportH	= renderTarget.getHeight();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();

		gl.genFramebuffers(1, &m_fbo);
		gl.genRenderbuffers(1, &m_rboC);
		gl.genRenderbuffers(1, &m_rboD);

		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rboC);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, viewportW, viewportH);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rboD);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, viewportW, viewportH);

		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rboC);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rboD);
	}